

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> * __thiscall
cfd::core::Psbt::GetGlobalXpubkeyDataList
          (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__return_storage_ptr__,
          Psbt *this)

{
  void *pvVar1;
  size_type __n;
  pointer puVar2;
  CfdException *this_00;
  size_type sVar3;
  long lVar4;
  long *plVar5;
  uint *__args;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ByteData fingerprint;
  ByteData key;
  ExtPubkey ext_pubkey;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_230;
  ByteData local_228;
  ByteData local_210;
  ExtPubkey local_1f8;
  undefined1 local_188 [344];
  
  pvVar1 = this->wally_psbt_pointer_;
  if (pvVar1 != (void *)0x0) {
    __n = *(size_type *)((long)pvVar1 + 0x48);
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_230 = __return_storage_ptr__;
    ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::reserve
              (__return_storage_ptr__,__n);
    if (__n != 0) {
      sVar3 = 0;
      do {
        if ((*(long *)(*(long *)((long)pvVar1 + 0x40) + 8 + sVar3 * 0x20) == 0x4f) &&
           (plVar5 = (long *)(*(long *)((long)pvVar1 + 0x40) + sVar3 * 0x20),
           *(char *)*plVar5 == '\x01')) {
          ByteData::ByteData(&local_210,(uint8_t *)(*plVar5 + 1),(int)plVar5[1] - 1);
          ExtPubkey::ExtPubkey(&local_1f8,&local_210);
          ByteData::ByteData(&local_228);
          local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (uint *)0x0;
          local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
          if (plVar5[3] != 0 && (plVar5[3] & 3U) == 0) {
            ByteData::ByteData((ByteData *)local_188,(uint8_t *)plVar5[2],4);
            puVar2 = local_228.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_188._0_8_;
            local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_188._8_8_;
            local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_188._16_8_;
            local_188._0_8_ = (pointer)0x0;
            local_188._8_8_ = (pointer)0x0;
            local_188._16_8_ = (pointer)0x0;
            if (puVar2 != (pointer)0x0) {
              operator_delete(puVar2);
            }
            if ((pointer)local_188._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_188._0_8_);
            }
            if (7 < (ulong)plVar5[3]) {
              __args = (uint *)plVar5[2];
              lVar4 = ((ulong)plVar5[3] >> 2) - 1;
              do {
                __args = __args + 1;
                if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_248,
                             (iterator)
                             local_248.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,__args);
                }
                else {
                  *local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish = *__args;
                  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                lVar4 = lVar4 + -1;
              } while (lVar4 != 0);
            }
          }
          KeyData::KeyData((KeyData *)local_188,&local_1f8,&local_248,&local_228);
          __return_storage_ptr__ = local_230;
          ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
          emplace_back<cfd::core::KeyData>(local_230,(KeyData *)local_188);
          KeyData::~KeyData((KeyData *)local_188);
          if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_228.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1f8.tweak_sum_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.tweak_sum_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1f8.pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.pubkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1f8.chaincode_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.chaincode_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1f8.serialize_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f8.serialize_data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_210.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_210.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        sVar3 = sVar3 + 1;
      } while (sVar3 != __n);
    }
    return __return_storage_ptr__;
  }
  local_188._0_8_ = "cfdcore_psbt.cpp";
  local_188._8_4_ = 0xc9f;
  local_188._16_8_ = "GetGlobalXpubkeyDataList";
  logger::log<>((CfdSourceLocation *)local_188,kCfdLogLevelWarning,"psbt pointer is null");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_188._0_8_ = local_188 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"psbt pointer is null.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_188);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<KeyData> Psbt::GetGlobalXpubkeyDataList() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }

  size_t key_max = psbt_pointer->unknowns.num_items;
  std::vector<KeyData> arr;
  arr.reserve(key_max);
  struct wally_map_item *item;
  for (size_t key_index = 0; key_index < key_max; ++key_index) {
    item = &psbt_pointer->unknowns.items[key_index];
    if (item->key_len != kPsbtGlobalXpubSize) continue;
    if (item->key[0] != Psbt::kPsbtGlobalXpub) continue;
    ByteData key(&item->key[1], static_cast<uint32_t>(item->key_len) - 1);
    ExtPubkey ext_pubkey(key);

    ByteData fingerprint;
    std::vector<uint32_t> path;
    if (((item->value_len % 4) == 0) && (item->value_len > 0)) {
      fingerprint = ByteData(item->value, 4);

      // TODO(k-matsuzawa) Need endian support.
      size_t arr_max = item->value_len / 4;
      uint32_t *val_arr = reinterpret_cast<uint32_t *>(item->value);
      for (size_t arr_index = 1; arr_index < arr_max; ++arr_index) {
        path.push_back(val_arr[arr_index]);
      }
    }
    arr.emplace_back(KeyData(ext_pubkey, path, fingerprint));
  }
  return arr;
}